

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

void cmSourceFileSetName2(void *arg,char *name,char *dir,char *ext,int headerFileOnly)

{
  char *pcVar1;
  string fname;
  string local_70;
  string local_50;
  
  if (*arg == 0) {
    if (headerFileOnly != 0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"HEADER_FILE_ONLY","");
      cmPropertyMap::SetProperty((cmPropertyMap *)((long)arg + 0x80),&local_70,"1");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar1 = *(char **)((long)arg + 0x10);
    strlen(name);
    std::__cxx11::string::_M_replace((long)arg + 8,0,pcVar1,(ulong)name);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,*(long *)((long)arg + 8),
               *(long *)((long)arg + 0x10) + *(long *)((long)arg + 8));
    if ((ext != (char *)0x0) && (*ext != '\0')) {
      std::__cxx11::string::append((char *)&local_70);
      std::__cxx11::string::append((char *)&local_70);
    }
    cmsys::SystemTools::CollapseFullPath(&local_50,&local_70,dir);
    std::__cxx11::string::operator=((string *)((long)arg + 0x48),(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::ConvertToUnixSlashes((string *)((long)arg + 0x48));
    pcVar1 = *(char **)((long)arg + 0x30);
    strlen(ext);
    std::__cxx11::string::_M_replace((long)arg + 0x28,0,pcVar1,(ulong)ext);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void CCONV cmSourceFileSetName2(void* arg, const char* name, const char* dir,
                                const char* ext, int headerFileOnly)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (sf->RealSourceFile) {
    // SetName is allowed only on temporary source files created by
    // the command for building and passing to AddSource.
    return;
  }

  // Implement the old SetName method code here.
  if (headerFileOnly) {
    sf->Properties.SetProperty("HEADER_FILE_ONLY", "1");
  }
  sf->SourceName = name;
  std::string fname = sf->SourceName;
  if (ext && strlen(ext)) {
    fname += ".";
    fname += ext;
  }
  sf->FullPath = cmSystemTools::CollapseFullPath(fname, dir);
  cmSystemTools::ConvertToUnixSlashes(sf->FullPath);
  sf->SourceExtension = ext;
}